

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMatterMeshless::RemoveCollisionModelsFromSystem(ChMatterMeshless *this)

{
  ChSystem *pCVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((this->super_ChIndexedNodes).super_ChPhysicsItem.system != (ChSystem *)0x0) {
    if ((this->nodes).
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->nodes).
        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        pCVar1 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
        peVar2 = (pCVar1->collision_system).
                 super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        this_00 = (pCVar1->collision_system).
                  super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        (*peVar2->_vptr_ChCollisionSystem[5])
                  (peVar2,((this->nodes).
                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar4].
                           super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->collision_model);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        bVar3 = uVar5 < (ulong)((long)(this->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4);
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar3);
    }
    return;
  }
  __assert_fail("GetSystem()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                ,0x2b7,
                "virtual void chrono::fea::ChMatterMeshless::RemoveCollisionModelsFromSystem()");
}

Assistant:

void ChMatterMeshless::RemoveCollisionModelsFromSystem() {
    assert(GetSystem());
    for (unsigned int j = 0; j < nodes.size(); j++) {
        GetSystem()->GetCollisionSystem()->Remove(nodes[j]->collision_model);
    }
}